

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void anon_unknown.dwarf_12e14a::ChangeInstructionTo
               (VmModule *module,VmInstruction *inst,VmInstructionType cmd,VmValue *first,
               VmValue *second,VmValue *third,VmValue *fourth,VmValue *fifth,uint *optCount)

{
  VmValue **ppVVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint newSize;
  SmallArray<VmValue_*,_128U> local_448;
  
  inst->cmd = cmd;
  local_448.data = local_448.little;
  local_448.count = 0;
  local_448.max = 0x80;
  newSize = (inst->arguments).count;
  local_448.allocator = (Allocator *)module;
  if (newSize < 0x80) {
    uVar3 = 0;
    uVar4 = 0x80;
  }
  else {
    SmallArray<VmValue_*,_128U>::grow(&local_448,newSize);
    newSize = (inst->arguments).count;
    uVar3 = local_448.count;
    uVar4 = local_448.max;
  }
  ppVVar1 = (inst->arguments).data;
  if (uVar4 <= uVar3 + newSize) {
    SmallArray<VmValue_*,_128U>::grow(&local_448,uVar3 + newSize);
    uVar3 = local_448.count;
  }
  if (newSize != 0) {
    uVar5 = 0;
    do {
      local_448.data[uVar3 + (int)uVar5] = ppVVar1[uVar5];
      uVar5 = uVar5 + 1;
    } while (newSize != uVar5);
    local_448.count = uVar3 + (int)uVar5;
  }
  (inst->arguments).count = 0;
  if (first == (VmValue *)0x0) {
    if (second != (VmValue *)0x0) {
      __assert_fail("first",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x3d2,
                    "void (anonymous namespace)::ChangeInstructionTo(VmModule *, VmInstruction *, VmInstructionType, VmValue *, VmValue *, VmValue *, VmValue *, VmValue *, unsigned int *)"
                   );
    }
LAB_001af40d:
    if (third != (VmValue *)0x0) {
      __assert_fail("second",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x3d8,
                    "void (anonymous namespace)::ChangeInstructionTo(VmModule *, VmInstruction *, VmInstructionType, VmValue *, VmValue *, VmValue *, VmValue *, VmValue *, unsigned int *)"
                   );
    }
LAB_001af419:
    if (fourth != (VmValue *)0x0) {
      __assert_fail("third",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x3de,
                    "void (anonymous namespace)::ChangeInstructionTo(VmModule *, VmInstruction *, VmInstructionType, VmValue *, VmValue *, VmValue *, VmValue *, VmValue *, unsigned int *)"
                   );
    }
  }
  else {
    VmInstruction::AddArgument(inst,first);
    if (second == (VmValue *)0x0) goto LAB_001af40d;
    VmInstruction::AddArgument(inst,second);
    if (third == (VmValue *)0x0) goto LAB_001af419;
    VmInstruction::AddArgument(inst,third);
    if (fourth != (VmValue *)0x0) {
      VmInstruction::AddArgument(inst,fourth);
      if (fifth != (VmValue *)0x0) {
        VmInstruction::AddArgument(inst,fifth);
      }
      goto LAB_001af427;
    }
  }
  if (fifth != (VmValue *)0x0) {
    __assert_fail("fourth",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x3e4,
                  "void (anonymous namespace)::ChangeInstructionTo(VmModule *, VmInstruction *, VmInstructionType, VmValue *, VmValue *, VmValue *, VmValue *, VmValue *, unsigned int *)"
                 );
  }
LAB_001af427:
  if (local_448.count != 0) {
    uVar5 = 0;
    do {
      VmValue::RemoveUse(local_448.data[uVar5],&inst->super_VmValue);
      uVar5 = uVar5 + 1;
    } while (uVar5 < (local_448._8_8_ & 0xffffffff));
  }
  bVar2 = HasSideEffects(cmd);
  (inst->super_VmValue).hasSideEffects = bVar2;
  bVar2 = HasMemoryAccess(cmd);
  (inst->super_VmValue).hasMemoryAccess = bVar2;
  if (optCount != (uint *)0x0) {
    *optCount = *optCount + 1;
  }
  SmallArray<VmValue_*,_128U>::~SmallArray(&local_448);
  return;
}

Assistant:

void ChangeInstructionTo(VmModule *module, VmInstruction *inst, VmInstructionType cmd, VmValue *first, VmValue *second, VmValue *third, VmValue *fourth, VmValue *fifth, unsigned *optCount)
	{
		inst->cmd = cmd;

		SmallArray<VmValue*, 128> arguments(module->allocator);
		arguments.reserve(inst->arguments.size());
		arguments.push_back(inst->arguments.data, inst->arguments.size());

		inst->arguments.clear();

		if(first)
			inst->AddArgument(first);

		if(second)
		{
			assert(first);
			inst->AddArgument(second);
		}

		if(third)
		{
			assert(second);
			inst->AddArgument(third);
		}

		if(fourth)
		{
			assert(third);
			inst->AddArgument(fourth);
		}

		if(fifth)
		{
			assert(fourth);
			inst->AddArgument(fifth);
		}

		for(unsigned i = 0; i < arguments.size(); i++)
			arguments[i]->RemoveUse(inst);

		inst->hasSideEffects = HasSideEffects(cmd);
		inst->hasMemoryAccess = HasMemoryAccess(cmd);

		if(optCount)
			(*optCount)++;
	}